

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O2

bool dg::vr::RelationsAnalyzer::operandsEqual(ValueRelations *graph,I fst,I snd,bool sameOrder)

{
  bool bVar1;
  uint i;
  uint i_00;
  uint uVar2;
  bool bVar3;
  Value *local_40;
  Value *local_38;
  
  uVar2 = *(uint *)(fst + 0x14) & 0x7ffffff;
  i_00 = 0;
  bVar3 = false;
  if (uVar2 == (*(uint *)(snd + 0x14) & 0x7ffffff)) {
    do {
      uVar2 = uVar2 - 1;
      bVar3 = uVar2 == 0xffffffff;
      if (bVar3) {
        return bVar3;
      }
      i = uVar2;
      if (sameOrder) {
        i = i_00;
      }
      local_38 = llvm::User::getOperand((User *)fst,i_00);
      local_40 = llvm::User::getOperand((User *)snd,i);
      bVar1 = ValueRelations::isEqual<llvm::Value*,llvm::Value*>(graph,&local_38,&local_40);
      i_00 = i_00 + 1;
    } while (bVar1);
  }
  return bVar3;
}

Assistant:

bool RelationsAnalyzer::operandsEqual(
        ValueRelations &graph, I fst, I snd,
        bool sameOrder) { // false means checking in reverse order
    unsigned total = fst->getNumOperands();
    if (total != snd->getNumOperands())
        return false;

    for (unsigned i = 0; i < total; ++i) {
        unsigned otherI = sameOrder ? i : total - i - 1;

        if (!graph.isEqual(fst->getOperand(i), snd->getOperand(otherI)))
            return false;
    }
    return true;
}